

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Escape::CGraph::writeBinaryFile(CGraph *this,char *path)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ostream *this_00;
  char local_218 [8];
  ofstream out_file;
  char *path_local;
  CGraph *this_local;
  
  _Var2 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(local_218,path,_Var2);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    printf("Could not write to the file %s",path);
  }
  else {
    std::ostream::write(local_218,(long)this);
    std::ostream::write(local_218,(long)&this->nEdges);
    std::ostream::write(local_218,(long)this->offsets);
    std::ostream::write(local_218,(long)this->nbors);
    std::ofstream::close();
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      this_00 = std::operator<<((ostream *)&std::cout,"Error occurred at writing time!");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void CGraph::writeBinaryFile(const char *path) {
    auto out_file = std::ofstream(path, std::ios::out | std::ios::binary);
    if ( !out_file.is_open() ) {
        printf("Could not write to the file %s",path);
        return;
    }
    out_file.write(reinterpret_cast<const char*>(&nVertices), sizeof(nVertices));
    out_file.write(reinterpret_cast<const char*>(&nEdges), sizeof(nEdges));
    out_file.write(reinterpret_cast<const char*>(offsets), std::streamsize((nVertices+1)* sizeof(VertexIdx)));
    out_file.write(reinterpret_cast<const char*>(nbors), nEdges*sizeof(EdgeIdx));
    out_file.close();
    if(!out_file.good()) {
        std::cout << "Error occurred at writing time!" << std::endl;
    }
}